

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

void parseGPLFile(filebuf *file)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  bool bVar4;
  ushort uVar5;
  optional<Rgba> oVar6;
  size_type sVar7;
  Rgba *pRVar8;
  reference this;
  reference pvVar9;
  _Storage<Rgba,_true> local_55;
  undefined1 local_51;
  size_type sStack_50;
  optional<Rgba> color;
  size_type n;
  uint16_t maxNbColors;
  uint16_t nbColors;
  undefined1 local_30 [8];
  string line;
  filebuf *file_local;
  
  line.field_2._8_8_ = file;
  std::__cxx11::string::string((string *)local_30);
  readLine((filebuf *)line.field_2._8_8_,(string *)local_30);
  bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                      "GIMP Palette");
  if (bVar4) {
    n._6_2_ = 0;
    uVar5 = (ushort)options.nbColorsPerPal * (ushort)options.nbPalettes;
    while( true ) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      readLine((filebuf *)line.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
      if (sVar7 == 0) break;
      bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"#");
      if (((!bVar4) &&
          (bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   starts_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30,"Name:"), !bVar4)) &&
         (bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"Column:"), !bVar4)) {
        sStack_50 = 0;
        oVar6 = parseColor((string *)local_30,&stack0xffffffffffffffb0,n._6_2_ + 1);
        local_55 = oVar6.super__Optional_base<Rgba,_true,_true>._M_payload.
                   super__Optional_payload_base<Rgba>._M_payload;
        local_51 = oVar6.super__Optional_base<Rgba,_true,_true>._M_payload.
                   super__Optional_payload_base<Rgba>._M_engaged;
        bVar4 = std::optional::operator_cast_to_bool((optional *)&local_55._M_value);
        if (!bVar4) goto LAB_00124c52;
        n._6_2_ = n._6_2_ + 1;
        if (n._6_2_ < uVar5) {
          if ((int)((ulong)n._6_2_ % (ulong)(long)(int)(uint)options.nbColorsPerPal) == 1) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            emplace_back<>(&options.palSpec);
          }
          pRVar8 = std::optional<Rgba>::operator*((optional<Rgba> *)&local_55._M_value);
          this = std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::back
                           (&options.palSpec);
          pvVar9 = std::array<Rgba,_4UL>::operator[]
                             (this,(long)(int)((ulong)n._6_2_ %
                                              (ulong)(long)(int)(uint)options.nbColorsPerPal));
          uVar1 = pRVar8->green;
          uVar2 = pRVar8->blue;
          uVar3 = pRVar8->alpha;
          pvVar9->red = pRVar8->red;
          pvVar9->green = uVar1;
          pvVar9->blue = uVar2;
          pvVar9->alpha = uVar3;
        }
      }
    }
    if (uVar5 < n._6_2_) {
      warning("GPL file contains %u colors, but there can only be %u; ignoring extra",(ulong)n._6_2_
              ,(ulong)uVar5);
    }
  }
  else {
    error("Palette file does not appear to be a GPL palette file");
  }
LAB_00124c52:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void parseGPLFile(std::filebuf &file) {
	// https://gitlab.gnome.org/GNOME/gimp/-/blob/gimp-2-10/app/core/gimppalette-load.c#L39

	std::string line;
	readLine(file, line);
	if (!line.starts_with("GIMP Palette")) {
		error("Palette file does not appear to be a GPL palette file");
		return;
	}

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		line.clear();
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.starts_with("#") || line.starts_with("Name:") || line.starts_with("Column:")) {
			continue;
		}

		std::string::size_type n = 0;
		std::optional<Rgba> color = parseColor(line, n, nbColors + 1);
		if (!color) {
			return;
		}

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = *color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("GPL file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}